

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdopt.c
# Opt level: O0

int get_block_temp_var(AV1_COMP *cpi,MACROBLOCK *x,BLOCK_SIZE bsize)

{
  BLOCK_SIZE in_DL;
  long in_RSI;
  long in_RDI;
  int is_low_temp_var;
  int mi_col;
  int mi_row;
  SPEED_FEATURES *sf;
  AV1_COMMON *cm;
  undefined4 local_3c;
  undefined4 local_4;
  
  if (((*(char *)(in_RDI + 0x60950) == '\x02') && (*(int *)(in_RDI + 0x60ccc) != 0)) &&
     (*(int *)(in_RDI + 0x60d7c) != 0)) {
    if (*(char *)(*(long *)(in_RDI + 0x42008) + 0x1c) == '\f') {
      local_3c = av1_get_force_skip_low_temp_var_small_sb
                           ((uint8_t *)(in_RSI + 0x18ba0),*(int *)(in_RSI + 0x1a0),
                            *(int *)(in_RSI + 0x1a4),in_DL);
    }
    else {
      local_3c = av1_get_force_skip_low_temp_var
                           ((uint8_t *)(in_RSI + 0x18ba0),*(int *)(in_RSI + 0x1a0),
                            *(int *)(in_RSI + 0x1a4),in_DL);
    }
    local_4 = local_3c;
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static inline int get_block_temp_var(const AV1_COMP *cpi, const MACROBLOCK *x,
                                     BLOCK_SIZE bsize) {
  const AV1_COMMON *const cm = &cpi->common;
  const SPEED_FEATURES *const sf = &cpi->sf;

  if (sf->part_sf.partition_search_type != VAR_BASED_PARTITION ||
      !sf->rt_sf.short_circuit_low_temp_var ||
      !sf->rt_sf.prune_inter_modes_using_temp_var) {
    return 0;
  }

  const int mi_row = x->e_mbd.mi_row;
  const int mi_col = x->e_mbd.mi_col;
  int is_low_temp_var = 0;

  if (cm->seq_params->sb_size == BLOCK_64X64)
    is_low_temp_var = av1_get_force_skip_low_temp_var_small_sb(
        &x->part_search_info.variance_low[0], mi_row, mi_col, bsize);
  else
    is_low_temp_var = av1_get_force_skip_low_temp_var(
        &x->part_search_info.variance_low[0], mi_row, mi_col, bsize);

  return is_low_temp_var;
}